

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameterization.cpp
# Opt level: O0

void __thiscall Parameterization::PrintPlot3D(Parameterization *this,ofstream *outfile)

{
  ostream *poVar1;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  ofstream *outfile_local;
  Parameterization *this_local;
  
  (**this->_vptr_Parameterization)(this,outfile);
  this->G = 0;
  while (this->G < this->Gmax) {
    (*this->_vptr_Parameterization[5])(this,(ulong)(uint)this->G);
    this->L = 0;
    while (this->L < this->Lmax) {
      this->K = 0;
      while (this->K < this->Kmax) {
        this->J = 0;
        while (this->J < this->Jmax) {
          (*this->_vptr_Parameterization[2])
                    (this,(ulong)(uint)this->J,(ulong)(uint)this->K,(ulong)(uint)this->L,
                     (ulong)(uint)this->G);
          poVar1 = (ostream *)std::ostream::operator<<((ostream *)outfile,extraout_XMM0_Qa);
          std::operator<<(poVar1," ");
          this->J = this->J + 1;
        }
        this->K = this->K + 1;
      }
      std::ostream::operator<<((ostream *)outfile,std::endl<char,std::char_traits<char>>);
      this->L = this->L + 1;
    }
    this->L = 0;
    while (this->L < this->Lmax) {
      this->K = 0;
      while (this->K < this->Kmax) {
        this->J = 0;
        while (this->J < this->Jmax) {
          (*this->_vptr_Parameterization[3])
                    (this,(ulong)(uint)this->J,(ulong)(uint)this->K,(ulong)(uint)this->L,
                     (ulong)(uint)this->G);
          poVar1 = (ostream *)std::ostream::operator<<((ostream *)outfile,extraout_XMM0_Qa_00);
          std::operator<<(poVar1," ");
          this->J = this->J + 1;
        }
        this->K = this->K + 1;
      }
      std::ostream::operator<<((ostream *)outfile,std::endl<char,std::char_traits<char>>);
      this->L = this->L + 1;
    }
    this->L = 0;
    while (this->L < this->Lmax) {
      this->K = 0;
      while (this->K < this->Kmax) {
        this->J = 0;
        while (this->J < this->Jmax) {
          (*this->_vptr_Parameterization[4])
                    (this,(ulong)(uint)this->J,(ulong)(uint)this->K,(ulong)(uint)this->L,
                     (ulong)(uint)this->G);
          poVar1 = (ostream *)std::ostream::operator<<((ostream *)outfile,extraout_XMM0_Qa_01);
          std::operator<<(poVar1," ");
          this->J = this->J + 1;
        }
        this->K = this->K + 1;
      }
      std::ostream::operator<<((ostream *)outfile,std::endl<char,std::char_traits<char>>);
      this->L = this->L + 1;
    }
    this->G = this->G + 1;
  }
  return;
}

Assistant:

void Parameterization::PrintPlot3D(ofstream& outfile) {

  PrintPlot3DHeader(outfile);

  for (G = 0; G < Gmax; G++) {

    setGridIndexRanges(G);

    // All x-coordinates
    for (L = 0; L < Lmax; L++) {
    for (K = 0; K < Kmax; K++) {
    for (J = 0; J < Jmax; J++) {
      outfile << coordinateX(J, K, L, G) << " ";
    }
    }
    outfile << endl;
    }

    // All y-coordinates
    for (L = 0; L < Lmax; L++) {
    for (K = 0; K < Kmax; K++) {
    for (J = 0; J < Jmax; J++) {
      outfile << coordinateY(J, K, L, G) << " ";
    }
    }
    outfile << endl;
    }

    // All z-coordinates
    for (L = 0; L < Lmax; L++) {
    for (K = 0; K < Kmax; K++) {
    for (J = 0; J < Jmax; J++) {
      outfile << coordinateZ(J, K, L, G) << " ";
    }
    }
    outfile << endl;
    }

  }  //End: G for-loop
}